

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O0

void mi_block_set_next(mi_page_t *page,mi_block_t *block,mi_block_t *next)

{
  mi_block_t *in_RDX;
  mi_block_t *in_RSI;
  void *in_RDI;
  
  mi_block_set_nextx(in_RDI,in_RSI,in_RDX,(uintptr_t *)0x0);
  return;
}

Assistant:

static inline void mi_block_set_next(const mi_page_t* page, mi_block_t* block, const mi_block_t* next) {
  #ifdef MI_ENCODE_FREELIST
  mi_block_set_nextx(page,block,next, page->keys);
  #else
  MI_UNUSED(page);
  mi_block_set_nextx(page,block,next,NULL);
  #endif
}